

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O1

string * __thiscall ByteString::hex_str_abi_cxx11_(string *__return_storage_ptr__,ByteString *this)

{
  pointer puVar1;
  ulong uVar2;
  char hex [3];
  char local_33 [3];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    uVar2 = 0;
    do {
      snprintf(local_33,3,"%02X",(ulong)puVar1[uVar2]);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = uVar2 + 1;
      puVar1 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->byteString).
                                   super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ByteString::hex_str() const
{
	std::string rv;
	char hex[3];

	for (size_t i = 0; i < byteString.size(); i++)
	{
		snprintf(hex, sizeof(hex), "%02X", byteString[i]);
		rv += hex;
	}

	return rv;
}